

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMem.c
# Opt level: O0

void Ivy_ManAddMemory(Ivy_Man_t *p)

{
  void *Entry;
  int EntrySizeMax;
  int nBytes;
  int i;
  char *pMemory;
  Ivy_Man_t *p_local;
  
  if (p->pListFree != (Ivy_Obj_t *)0x0) {
    __assert_fail("p->pListFree == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyMem.c"
                  ,0x5f,"void Ivy_ManAddMemory(Ivy_Man_t *)");
  }
  Entry = malloc(0x50080);
  Vec_PtrPush(p->vChunks,Entry);
  _nBytes = (Ivy_Obj_t *)((long)Entry + (0x80 - (long)(int)((uint)Entry & 0x7f)));
  Vec_PtrPush(p->vPages,_nBytes);
  p->pListFree = _nBytes;
  for (EntrySizeMax = 1; EntrySizeMax < 0x1000; EntrySizeMax = EntrySizeMax + 1) {
    *(Ivy_Obj_t **)_nBytes = _nBytes + 1;
    _nBytes = _nBytes + 1;
  }
  _nBytes->Id = 0;
  _nBytes->TravId = 0;
  return;
}

Assistant:

void Ivy_ManAddMemory( Ivy_Man_t * p )
{
    char * pMemory;
    int i, nBytes;
    int EntrySizeMax = 128;
    assert( sizeof(Ivy_Obj_t) <= EntrySizeMax );
    assert( p->pListFree == NULL );
//    assert( (Ivy_ManObjNum(p) & IVY_PAGE_MASK) == 0 );
    // allocate new memory page
    nBytes = sizeof(Ivy_Obj_t) * (1<<IVY_PAGE_SIZE) + EntrySizeMax;
    pMemory = ABC_ALLOC( char, nBytes );
    Vec_PtrPush( p->vChunks, pMemory );
    // align memory at the 32-byte boundary
    pMemory = pMemory + EntrySizeMax - (((int)(ABC_PTRUINT_T)pMemory) & (EntrySizeMax-1));
    // remember the manager in the first entry
    Vec_PtrPush( p->vPages, pMemory );
    // break the memory down into nodes
    p->pListFree = (Ivy_Obj_t *)pMemory;
    for ( i = 1; i <= IVY_PAGE_MASK; i++ )
    {
        *((char **)pMemory) = pMemory + sizeof(Ivy_Obj_t);
        pMemory += sizeof(Ivy_Obj_t);
    }
    *((char **)pMemory) = NULL;
}